

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

void __thiscall
glu::ShaderProgram::ShaderProgram(ShaderProgram *this,Functions *gl,ProgramSources *sources)

{
  memset(this,0,0x90);
  Program::Program(&this->m_program,gl);
  init(this,(EVP_PKEY_CTX *)gl);
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const glw::Functions& gl, const ProgramSources& sources)
	: m_program(gl)
{
	init(gl, sources);
}